

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O0

bool ValidateMauChannelConfig(MauChannelConfig *config)

{
  bool bVar1;
  long in_RDI;
  undefined1 local_1;
  
  bVar1 = IsWithin01(*(float *)(in_RDI + 4));
  if (bVar1) {
    bVar1 = IsWithin01(*(float *)(in_RDI + 8));
    if (bVar1) {
      if (0.01 < *(float *)(in_RDI + 0xc)) {
        if (*(uint *)(in_RDI + 0x10) < 0xb) {
          local_1 = false;
        }
        else if (*(uint *)(in_RDI + 0x28) < *(uint *)(in_RDI + 0x24)) {
          local_1 = false;
        }
        else {
          bVar1 = IsWithin01(*(float *)(in_RDI + 0x2c));
          if (bVar1) {
            bVar1 = IsWithin01(*(float *)(in_RDI + 0x30));
            if (bVar1) {
              bVar1 = IsWithin01(*(float *)(in_RDI + 0x34));
              if (bVar1) {
                bVar1 = IsWithin01(*(float *)(in_RDI + 0x38));
                if (bVar1) {
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ValidateMauChannelConfig(const MauChannelConfig& config)
{
    if (!IsWithin01(config.LossRate)) {
        return false;
    }
    if (!IsWithin01(config.DeliveryRate)) {
        return false;
    }

    if (config.Router_MBPS <= 0.01f) {
        return false;
    }
    if (config.Router_QueueMsec <= 10) {
        return false;
    }

    if (config.ReorderMaximumLatencyMsec < config.ReorderMinimumLatencyMsec) {
        return false;
    }

    if (!IsWithin01(config.ReorderRate)) {
        return false;
    }
    if (!IsWithin01(config.OrderRate)) {
        return false;
    }

    if (!IsWithin01(config.DuplicateRate)) {
        return false;
    }
    if (!IsWithin01(config.CorruptionRate)) {
        return false;
    }

    return true;
}